

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::QUICMethodTest_NoZeroRTTTicketWithoutEarlyDataContext_Test::TestBody
          (QUICMethodTest_NoZeroRTTTicketWithoutEarlyDataContext_Test *this)

{
  int iVar1;
  char *in_R9;
  pointer *__ptr;
  UniquePtr<SSL_SESSION> session;
  AssertionResult gtest_ar_;
  SSL_QUIC_METHOD quic_method;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_80;
  _Head_base<0UL,_ssl_session_st_*,_false> local_78;
  internal local_70 [8];
  _Head_base<0UL,_ssl_ctx_st_*,_false> local_68;
  AssertHelper local_60;
  string local_58;
  SSL_QUIC_METHOD local_38;
  
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)
             &(this->super_QUICMethodTest).server_quic_early_data_context_,0,0);
  local_38.set_read_secret = QUICMethodTest::SetReadSecretCallback;
  local_38.set_write_secret = QUICMethodTest::SetWriteSecretCallback;
  local_38.add_handshake_data = QUICMethodTest::AddHandshakeDataCallback;
  local_38.flush_flight = QUICMethodTest::FlushFlightCallback;
  local_38.send_alert = QUICMethodTest::SendAlertCallback;
  SSL_CTX_set_session_cache_mode
            ((this->super_QUICMethodTest).client_ctx_._M_t.
             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,3);
  SSL_CTX_set_early_data_enabled
            ((this->super_QUICMethodTest).client_ctx_._M_t.
             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,1);
  SSL_CTX_set_early_data_enabled
            ((this->super_QUICMethodTest).server_ctx_._M_t.
             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,1);
  iVar1 = SSL_CTX_set_quic_method
                    ((this->super_QUICMethodTest).client_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,&local_38);
  local_70[0] = (internal)(iVar1 != 0);
  local_68._M_head_impl = (ssl_ctx_st *)0x0;
  if (iVar1 == 0) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,local_70,
               (AssertionResult *)"SSL_CTX_set_quic_method(client_ctx_.get(), &quic_method)","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1db2,local_58._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_78);
LAB_001c2e9f:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,(ulong)(local_58.field_2._M_allocated_capacity + 1))
      ;
    }
    if (local_78._M_head_impl != (SSL_SESSION *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
    if ((_Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>)local_68._M_head_impl !=
        (ssl_ctx_st *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_68._M_head_impl);
    }
    return;
  }
  iVar1 = SSL_CTX_set_quic_method
                    ((this->super_QUICMethodTest).server_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,&local_38);
  local_70[0] = (internal)(iVar1 != 0);
  local_68._M_head_impl = (ssl_ctx_st *)0x0;
  if (!(bool)local_70[0]) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,local_70,
               (AssertionResult *)"SSL_CTX_set_quic_method(server_ctx_.get(), &quic_method)","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1db3,local_58._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_78);
    goto LAB_001c2e9f;
  }
  QUICMethodTest::CreateClientSessionForQUIC((QUICMethodTest *)&local_78);
  local_70[0] = (internal)(local_78._M_head_impl != (SSL_SESSION *)0x0);
  local_68._M_head_impl = (ssl_ctx_st *)0x0;
  if (local_78._M_head_impl == (SSL_SESSION *)0x0) {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,local_70,(AssertionResult *)0x35c794,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1db6,local_58._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_80);
  }
  else {
    iVar1 = SSL_SESSION_early_data_capable(local_78._M_head_impl);
    local_70[0] = (internal)(iVar1 == 0);
    local_68._M_head_impl = (ssl_ctx_st *)0x0;
    if ((bool)local_70[0]) goto LAB_001c2f86;
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,local_70,(AssertionResult *)"SSL_SESSION_early_data_capable(session.get())"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1db7,local_58._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_80);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,(ulong)(local_58.field_2._M_allocated_capacity + 1));
  }
  if (local_80._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_80._M_head_impl + 8))();
  }
LAB_001c2f86:
  if (local_68._M_head_impl != (ssl_ctx_st *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_68._M_head_impl);
  }
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&local_78);
  return;
}

Assistant:

TEST_F(QUICMethodTest, NoZeroRTTTicketWithoutEarlyDataContext) {
  server_quic_early_data_context_ = {};
  const SSL_QUIC_METHOD quic_method = DefaultQUICMethod();

  SSL_CTX_set_session_cache_mode(client_ctx_.get(), SSL_SESS_CACHE_BOTH);
  SSL_CTX_set_early_data_enabled(client_ctx_.get(), 1);
  SSL_CTX_set_early_data_enabled(server_ctx_.get(), 1);
  ASSERT_TRUE(SSL_CTX_set_quic_method(client_ctx_.get(), &quic_method));
  ASSERT_TRUE(SSL_CTX_set_quic_method(server_ctx_.get(), &quic_method));

  bssl::UniquePtr<SSL_SESSION> session = CreateClientSessionForQUIC();
  ASSERT_TRUE(session);
  EXPECT_FALSE(SSL_SESSION_early_data_capable(session.get()));
}